

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O0

UINT8 __thiscall PlayerA::Start(PlayerA *this)

{
  INT32 IVar1;
  int iVar2;
  UINT8 retVal;
  PlayerA *this_local;
  
  if (this->_player == (PlayerBase *)0x0) {
    this_local._7_1_ = 0xff;
  }
  else {
    (*this->_player->_vptr_PlayerBase[0xf])(this->_player,(ulong)this->_smplRate);
    (*this->_player->_vptr_PlayerBase[0x11])((this->_config).pbSpeed);
    IVar1 = CalcSongVolume(this);
    this->_songVolume = IVar1;
    this->_fadeSmplStart = 0xffffffff;
    this->_endSilenceStart = 0xffffffff;
    iVar2 = (*this->_player->_vptr_PlayerBase[0x1f])();
    this_local._7_1_ = (UINT8)iVar2;
    iVar2 = (*this->_player->_vptr_PlayerBase[0x19])();
    this->_myPlayState = (byte)iVar2 & 3;
  }
  return this_local._7_1_;
}

Assistant:

UINT8 PlayerA::Start(void)
{
	if (_player == NULL)
		return 0xFF;
	_player->SetSampleRate(_smplRate);
	_player->SetPlaybackSpeed(_config.pbSpeed);
	_songVolume = CalcSongVolume();
	_fadeSmplStart = (UINT32)-1;
	_endSilenceStart = (UINT32)-1;
	
	UINT8 retVal = _player->Start();
	_myPlayState = _player->GetState() & (PLAYSTATE_PLAY | PLAYSTATE_END);
	return retVal;
}